

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
Keno::generate20Numbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Keno *this)

{
  iterator __position;
  int iVar1;
  time_t tVar2;
  int iVar3;
  __node_base _Var4;
  int currNumber;
  Keno_HotAndCold info;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> rand20NumsSet;
  int local_7c;
  Keno_HotAndCold local_78;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  iVar3 = 0x14;
  do {
    iVar1 = rand();
    local_7c = iVar1 % 0x50 + 1;
    local_78._vectorTo80Nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_60;
    std::
    _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
              ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_60,&local_7c,&local_78);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  _Var4._M_nxt = local_60._M_before_begin._M_nxt;
  if (local_60._M_element_count < 0x14) {
    do {
      iVar3 = rand();
      local_7c = iVar3 % 0x50 + 1;
      local_78._vectorTo80Nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_60;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_60,&local_7c,&local_78);
      _Var4._M_nxt = local_60._M_before_begin._M_nxt;
    } while (local_60._M_element_count < 0x14);
  }
  for (; _Var4._M_nxt != (_Hash_node_base *)0x0; _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                 (int *)(_Var4._M_nxt + 1));
    }
    else {
      *__position._M_current = *(int *)&_Var4._M_nxt[1]._M_nxt;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  Keno_HotAndCold::Keno_HotAndCold(&local_78);
  Keno_HotAndCold::infoHotAndCold(&local_78,__return_storage_ptr__);
  Keno_HotAndCold::~Keno_HotAndCold(&local_78);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Keno::generate20Numbers() {
	srand(time(0));
	std::vector<int> rand20Nums;
	std::unordered_set<int> rand20NumsSet;
	int currNumber;
	int last = 80;
	int first = 1;
	int const maxNumbers =20;
	//int currNumberSet;
	for (int i = 0; i < maxNumbers; ++i) {
		currNumber = rand() % (last + 1 - first) + first;
		rand20NumsSet.insert(currNumber);
	}
	if (rand20NumsSet.size() < maxNumbers) {
		while (rand20NumsSet.size() < maxNumbers) {
			currNumber = rand() % (last + 1 - first) + first;
			rand20NumsSet.insert(currNumber);
		}
	}
	
		for (auto it = rand20NumsSet.begin(); it != rand20NumsSet.end(); ++it) {
			rand20Nums.push_back(*it);
		}
	
	Keno_HotAndCold info;
	info.infoHotAndCold(rand20Nums);
	return rand20Nums;
}